

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O0

void opengv::relative_pose::modules::fivept_kneip::groebnerRow37_000100000_f
               (Matrix<double,_66,_197,_0,_66,_197> *groebnerMatrix,int targetRow)

{
  Scalar SVar1;
  Scalar *pSVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  double factor;
  Index in_stack_fffffffffffffe28;
  DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *in_stack_fffffffffffffe30;
  DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *this;
  
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,0x100b280);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)*pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b2a1);
  dVar3 = (double)this / *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b2ce);
  *pSVar2 = 0.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b2fc);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b320);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SVar1;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *pSVar2;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar4,auVar31,auVar58);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b376);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b39a);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SVar1;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *pSVar2;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar5,auVar32,auVar59);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b3f0);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b414);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SVar1;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *pSVar2;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar6,auVar33,auVar60);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b46a);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b48e);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SVar1;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *pSVar2;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar7,auVar34,auVar61);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b4e4);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b508);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SVar1;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *pSVar2;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar8,auVar35,auVar62);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b55e);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b582);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SVar1;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *pSVar2;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar9,auVar36,auVar63);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b5d8);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b5fc);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = SVar1;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *pSVar2;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar10,auVar37,auVar64);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b655);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b67c);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = SVar1;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *pSVar2;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar11,auVar38,auVar65);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b6db);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b702);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = SVar1;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *pSVar2;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar12,auVar39,auVar66);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b761);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b788);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = SVar1;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *pSVar2;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar13,auVar40,auVar67);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b7e7);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b80e);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = SVar1;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *pSVar2;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar14,auVar41,auVar68);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b86d);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b894);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = SVar1;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *pSVar2;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar15,auVar42,auVar69);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b8f3);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b91a);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = SVar1;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *pSVar2;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar16,auVar43,auVar70);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b979);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b9a0);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = SVar1;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *pSVar2;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar17,auVar44,auVar71);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100b9ff);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100ba26);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = SVar1;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *pSVar2;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar18,auVar45,auVar72);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100ba85);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100baac);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = SVar1;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *pSVar2;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar19,auVar46,auVar73);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100bb0b);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100bb32);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = SVar1;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *pSVar2;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar20,auVar47,auVar74);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100bb91);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100bbb8);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = SVar1;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *pSVar2;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar21,auVar48,auVar75);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100bc17);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100bc3e);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = SVar1;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *pSVar2;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar22,auVar49,auVar76);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100bc9d);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100bcc4);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = SVar1;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *pSVar2;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar23,auVar50,auVar77);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100bd23);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100bd4a);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = SVar1;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *pSVar2;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar24,auVar51,auVar78);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100bda9);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100bdd0);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = SVar1;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *pSVar2;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar25,auVar52,auVar79);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100be2f);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100be56);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = SVar1;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *pSVar2;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar26,auVar53,auVar80);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100beb5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100bedc);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = SVar1;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *pSVar2;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar27,auVar54,auVar81);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100bf3b);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100bf62);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = SVar1;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *pSVar2;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar28,auVar55,auVar82);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100bfc1);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100bfe8);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = SVar1;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *pSVar2;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar29,auVar56,auVar83);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100c047);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe28,0x100c06e);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = SVar1;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *pSVar2;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar30,auVar57,auVar84);
  *pSVar2 = auVar4._0_8_;
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip::groebnerRow37_000100000_f( Eigen::Matrix<double,66,197> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,36) / groebnerMatrix(37,160);
  groebnerMatrix(targetRow,36) = 0.0;
  groebnerMatrix(targetRow,37) -= factor * groebnerMatrix(37,161);
  groebnerMatrix(targetRow,38) -= factor * groebnerMatrix(37,162);
  groebnerMatrix(targetRow,76) -= factor * groebnerMatrix(37,170);
  groebnerMatrix(targetRow,77) -= factor * groebnerMatrix(37,171);
  groebnerMatrix(targetRow,79) -= factor * groebnerMatrix(37,173);
  groebnerMatrix(targetRow,80) -= factor * groebnerMatrix(37,174);
  groebnerMatrix(targetRow,87) -= factor * groebnerMatrix(37,176);
  groebnerMatrix(targetRow,94) -= factor * groebnerMatrix(37,177);
  groebnerMatrix(targetRow,112) -= factor * groebnerMatrix(37,178);
  groebnerMatrix(targetRow,113) -= factor * groebnerMatrix(37,179);
  groebnerMatrix(targetRow,114) -= factor * groebnerMatrix(37,180);
  groebnerMatrix(targetRow,115) -= factor * groebnerMatrix(37,181);
  groebnerMatrix(targetRow,116) -= factor * groebnerMatrix(37,182);
  groebnerMatrix(targetRow,117) -= factor * groebnerMatrix(37,183);
  groebnerMatrix(targetRow,123) -= factor * groebnerMatrix(37,184);
  groebnerMatrix(targetRow,130) -= factor * groebnerMatrix(37,185);
  groebnerMatrix(targetRow,138) -= factor * groebnerMatrix(37,186);
  groebnerMatrix(targetRow,157) -= factor * groebnerMatrix(37,187);
  groebnerMatrix(targetRow,158) -= factor * groebnerMatrix(37,188);
  groebnerMatrix(targetRow,159) -= factor * groebnerMatrix(37,189);
  groebnerMatrix(targetRow,160) -= factor * groebnerMatrix(37,190);
  groebnerMatrix(targetRow,161) -= factor * groebnerMatrix(37,191);
  groebnerMatrix(targetRow,162) -= factor * groebnerMatrix(37,192);
  groebnerMatrix(targetRow,168) -= factor * groebnerMatrix(37,193);
  groebnerMatrix(targetRow,175) -= factor * groebnerMatrix(37,194);
  groebnerMatrix(targetRow,183) -= factor * groebnerMatrix(37,195);
  groebnerMatrix(targetRow,192) -= factor * groebnerMatrix(37,196);
}